

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O2

void __thiscall
Wasm::WasmBytecodeGenerator::EmitLoadConst
          (WasmBytecodeGenerator *this,EmitInfo dst,WasmConstLitNode cnst)

{
  _func_int *UNRECOVERED_JUMPTABLE;
  WasmCompilationException *this_00;
  ulong uVar1;
  IWasmByteCodeWriter *pIVar2;
  undefined8 uStackY_50;
  
  uVar1 = cnst.field_0.i64;
  switch(dst.type) {
  case FirstLocalType:
    (*this->m_writer->_vptr_IWasmByteCodeWriter[10])
              (this->m_writer,9,(ulong)dst & 0xffffffff,uVar1 & 0xffffffff);
    return;
  case I64:
    (*this->m_writer->_vptr_IWasmByteCodeWriter[0xb])
              (this->m_writer,0xb,(ulong)dst & 0xffffffff,uVar1);
    return;
  case F32:
    pIVar2 = this->m_writer;
    uVar1 = uVar1 & 0xffffffff;
    UNRECOVERED_JUMPTABLE = pIVar2->_vptr_IWasmByteCodeWriter[0xc];
    uStackY_50 = 0xd;
    break;
  case F64:
    pIVar2 = this->m_writer;
    UNRECOVERED_JUMPTABLE = pIVar2->_vptr_IWasmByteCodeWriter[0xd];
    uStackY_50 = 0xf;
    break;
  case V128:
    Simd::EnsureSimdIsEnabled();
    (*this->m_writer->_vptr_IWasmByteCodeWriter[0x17])
              (this->m_writer,0x18b,(ulong)dst & 0xffffffff,uVar1 & 0xffffffff,uVar1 >> 0x20,
               cnst.field_0._8_8_,cnst.field_0._12_4_);
    return;
  default:
    WasmTypes::
    CompileAssertCasesNoFailFast<(Wasm::WasmTypes::WasmType)1,(Wasm::WasmTypes::WasmType)2,(Wasm::WasmTypes::WasmType)3,(Wasm::WasmTypes::WasmType)4,(Wasm::WasmTypes::WasmType)5>
              ();
    this_00 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_00,L"Unknown type %u",(ulong)dst >> 0x20);
    __cxa_throw(this_00,&WasmCompilationException::typeinfo,
                WasmCompilationException::~WasmCompilationException);
  }
  (*UNRECOVERED_JUMPTABLE)(uVar1,pIVar2,uStackY_50,(ulong)dst & 0xffffffff);
  return;
}

Assistant:

void WasmBytecodeGenerator::EmitLoadConst(EmitInfo dst, WasmConstLitNode cnst)
{
    switch (dst.type)
    {
    case WasmTypes::F32:
        m_writer->AsmFloat1Const1(Js::OpCodeAsmJs::Ld_FltConst, dst.location, cnst.f32);
        break;
    case WasmTypes::F64:
        m_writer->AsmDouble1Const1(Js::OpCodeAsmJs::Ld_DbConst, dst.location, cnst.f64);
        break;
    case WasmTypes::I32:
        m_writer->AsmInt1Const1(Js::OpCodeAsmJs::Ld_IntConst, dst.location, cnst.i32);
        break;
    case WasmTypes::I64:
        m_writer->AsmLong1Const1(Js::OpCodeAsmJs::Ld_LongConst, dst.location, cnst.i64);
        break;
#ifdef ENABLE_WASM_SIMD
    case WasmTypes::V128:
    {
        Simd::EnsureSimdIsEnabled();
        m_writer->WasmSimdConst(Js::OpCodeAsmJs::Simd128_LdC, dst.location, cnst.v128[0], cnst.v128[1], cnst.v128[2], cnst.v128[3]);
        break;
    }
#endif
    default:
        WasmTypes::CompileAssertCasesNoFailFast<WasmTypes::I32, WasmTypes::I64, WasmTypes::F32, WasmTypes::F64, WASM_V128_CHECK_TYPE>();
        throw WasmCompilationException(_u("Unknown type %u"), dst.type);
    }
}